

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<fd::AccuracyOrder>::
Generators<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,fd::AccuracyOrder,fd::AccuracyOrder,fd::AccuracyOrder>
          (Generators<fd::AccuracyOrder> *this,GeneratorWrapper<fd::AccuracyOrder> *moreGenerators,
          AccuracyOrder *moreGenerators_1,AccuracyOrder *moreGenerators_2,
          AccuracyOrder *moreGenerators_3)

{
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_dataplus._M_p =
       (pointer)&(this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase.
                 m_stringReprCache.field_2;
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase.m_stringReprCache.field_2.
  _M_local_buf[0] = '\0';
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase
       = (_func_int **)&PTR_next_001c50f8;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ::reserve(&this->m_generators,4);
  add_generators<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,fd::AccuracyOrder,fd::AccuracyOrder,fd::AccuracyOrder>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }